

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

bool __thiscall FatSystem::findDirectory(FatSystem *this,FatPath *path,FatEntry *outputEntry)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  __type local_19a;
  string local_170;
  FatEntry *local_150;
  byte local_142;
  byte local_141;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  string name;
  FatEntry *entry;
  FatEntry *local_d0;
  byte local_c1;
  iterator iStack_c0;
  bool found;
  iterator it;
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  string local_80;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  int cluster;
  FatEntry *outputEntry_local;
  FatPath *path_local;
  FatSystem *this_local;
  
  FatPath::getParts_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48,path);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)this->rootDirectory;
  outputEntry->cluster =
       parts.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  for (local_4c = 0; uVar2 = (ulong)local_4c,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48), uVar2 < sVar3; local_4c = local_4c + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,(long)local_4c);
    bVar1 = std::operator!=(pvVar4,"");
    if (bVar1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)local_4c);
      std::__cxx11::string::string
                ((string *)
                 &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)pvVar4);
      strtolower(&local_80,
                 (string *)
                 &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)local_4c);
      std::__cxx11::string::operator=((string *)pvVar4,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string
                ((string *)
                 &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      getEntries((vector<FatEntry,_std::allocator<FatEntry>_> *)&it,this,
                 parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int *)0x0,(bool *)0x0);
      __gnu_cxx::__normal_iterator<FatEntry_*,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>::
      __normal_iterator(&stack0xffffffffffffff40);
      local_c1 = 0;
      local_d0 = (FatEntry *)
                 std::vector<FatEntry,_std::allocator<FatEntry>_>::begin
                           ((vector<FatEntry,_std::allocator<FatEntry>_> *)&it);
      iStack_c0 = (iterator)local_d0;
      while( true ) {
        entry = (FatEntry *)
                std::vector<FatEntry,_std::allocator<FatEntry>_>::end
                          ((vector<FatEntry,_std::allocator<FatEntry>_> *)&it);
        bVar1 = __gnu_cxx::operator!=
                          (&stack0xffffffffffffff40,
                           (__normal_iterator<FatEntry_*,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>
                            *)&entry);
        if (!bVar1) break;
        name.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<FatEntry_*,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>::
             operator*(&stack0xffffffffffffff40);
        FatEntry::getFilename_abi_cxx11_((string *)local_100,(FatEntry *)name.field_2._8_8_);
        local_141 = 0;
        local_142 = 0;
        bVar1 = FatEntry::isDirectory((FatEntry *)name.field_2._8_8_);
        local_19a = false;
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_140,(string *)local_100);
          local_141 = 1;
          strtolower(&local_120,&local_140);
          local_142 = 1;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_48,(long)local_4c);
          local_19a = std::operator==(&local_120,pvVar4);
        }
        if ((local_142 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_120);
        }
        if ((local_141 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_140);
        }
        if (local_19a != false) {
          FatEntry::operator=(outputEntry,(FatEntry *)name.field_2._8_8_);
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               *(uint *)(name.field_2._8_8_ + 0x44);
          local_c1 = 1;
        }
        std::__cxx11::string::~string((string *)local_100);
        local_150 = (FatEntry *)
                    __gnu_cxx::
                    __normal_iterator<FatEntry_*,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>
                    ::operator++(&stack0xffffffffffffff40,0);
      }
      bVar1 = (local_c1 & 1) == 0;
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error: directory ");
        FatPath::getPath_abi_cxx11_(&local_170,path);
        poVar5 = std::operator<<(poVar5,(string *)&local_170);
        poVar5 = std::operator<<(poVar5," not found");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_170);
        this_local._7_1_ = 0;
      }
      std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector
                ((vector<FatEntry,_std::allocator<FatEntry>_> *)&it);
      if (bVar1) goto LAB_00126117;
    }
  }
  this_local._7_1_ = 1;
LAB_00126117:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FatSystem::findDirectory(FatPath &path, FatEntry &outputEntry)
{
    int cluster;
    vector<string> parts = path.getParts();
    cluster = rootDirectory;
    outputEntry.cluster = cluster;

    for (int i=0; i<parts.size(); i++) {
        if (parts[i] != "") {
            parts[i] = strtolower(parts[i]);
            vector<FatEntry> entries = getEntries(cluster);
            vector<FatEntry>::iterator it;
            bool found = false;

            for (it=entries.begin(); it!=entries.end(); it++) {
                FatEntry &entry = *it;
                string name = entry.getFilename();
                if (entry.isDirectory() && strtolower(name) == parts[i]) {
                    outputEntry = entry;
                    cluster = entry.cluster;
                    found = true;
                }
            }

            if (!found) {
                cerr << "Error: directory " << path.getPath() << " not found" << endl;
                return false;
            }
        }
    }

    return true;
}